

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode libcurl_generate_mime(curl_mime *mime,int *mimeno)

{
  char *str;
  int iVar1;
  uint uVar2;
  long local_70;
  int ownership;
  char *data;
  char *cp;
  char *escaped;
  char *filename;
  curl_mimepart *part;
  curl_off_t size;
  int i;
  CURLcode ret;
  int *mimeno_local;
  curl_mime *mime_local;
  
  size._4_4_ = 0;
  cp = (char *)0x0;
  easysrc_mime_count = easysrc_mime_count + 1;
  *mimeno = easysrc_mime_count;
  _i = (uint *)mimeno;
  mimeno_local = (int *)mime;
  size._4_4_ = easysrc_addf(&easysrc_decl,"curl_mime *mime%d;",(ulong)(uint)*mimeno);
  if (((((size._4_4_ == CURLE_OK) &&
        (size._4_4_ = easysrc_addf(&easysrc_data,"mime%d = NULL;",(ulong)*_i),
        size._4_4_ == CURLE_OK)) &&
       (size._4_4_ = easysrc_addf(&easysrc_code,"mime%d = curl_mime_init(hnd);",(ulong)*_i),
       size._4_4_ == CURLE_OK)) &&
      ((size._4_4_ = easysrc_addf(&easysrc_clean,"curl_mime_free(mime%d);",(ulong)*_i),
       size._4_4_ == CURLE_OK &&
       (size._4_4_ = easysrc_addf(&easysrc_clean,"mime%d = NULL;",(ulong)*_i),
       size._4_4_ == CURLE_OK)))) &&
     ((*(long *)(mimeno_local + 4) != 0 &&
      (size._4_4_ = easysrc_addf(&easysrc_decl,"curl_mimepart *part%d;",(ulong)*_i),
      size._4_4_ == CURLE_OK)))) {
    filename = *(char **)(mimeno_local + 4);
    do {
      if ((filename == (char *)0x0) ||
         (size._4_4_ = easysrc_addf(&easysrc_code,"part%d = curl_mime_addpart(mime%d);",(ulong)*_i,
                                    (ulong)*_i), size._4_4_ != CURLE_OK)) break;
      escaped = *(char **)(filename + 0x68);
      switch(*(undefined4 *)(filename + 0x18)) {
      case 1:
        str = *(char **)(filename + 0x20);
        for (data = str; *data != '\0'; data = data + 1) {
        }
        if (data == str + *(long *)(filename + 0x78)) {
          local_70 = -1;
        }
        else {
          local_70 = *(long *)(filename + 0x78);
        }
        free(cp);
        cp = c_escape(str,*(size_t *)(filename + 0x78));
        if (cp == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        if (local_70 < 0) {
          size._4_4_ = easysrc_addf(&easysrc_code,
                                    "curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                                    (ulong)*_i,cp);
        }
        else {
          size._4_4_ = easysrc_addf(&easysrc_code,"curl_mime_data(part%d, \"%s\", %ld);",(ulong)*_i,
                                    cp,local_70);
        }
        break;
      case 2:
        free(cp);
        cp = c_escape(*(char **)(filename + 0x20),0xffffffffffffffff);
        if (cp == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        size._4_4_ = easysrc_addf(&easysrc_code,"curl_mime_filedata(part%d, \"%s\");",(ulong)*_i,cp)
        ;
        if (size._4_4_ == CURLE_OK) {
          if (escaped == (char *)0x0) {
            size._4_4_ = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, NULL);",(ulong)*_i);
            break;
          }
          data = *(char **)(filename + 0x20);
          escaped = data;
          for (; *data != '\0'; data = data + 1) {
            if ((*data == '/') || (*data == '\\')) {
              escaped = data + 1;
            }
          }
          if ((*(long *)(filename + 0x68) == 0) ||
             (iVar1 = strcmp(escaped,*(char **)(filename + 0x68)), iVar1 == 0)) {
            escaped = (char *)0x0;
          }
          else {
            escaped = *(char **)(filename + 0x68);
          }
          goto switchD_0011f075_default;
        }
        goto LAB_0011f643;
      case 3:
        size._4_4_ = easysrc_addf(&easysrc_code,
                                  "curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
                                  (ulong)*_i);
        if (size._4_4_ != CURLE_OK) goto LAB_0011f643;
        size._4_4_ = easysrc_add(&easysrc_code,
                                 "                  (curl_seek_callback) fseek, NULL, stdin);");
        break;
      case 4:
        size._4_4_ = libcurl_generate_mime(*(curl_mime **)(filename + 0x40),(int *)&size);
        if ((size._4_4_ != CURLE_OK) ||
           (size._4_4_ = easysrc_addf(&easysrc_code,"curl_mime_subparts(part%d, mime%d);",(ulong)*_i
                                      ,(ulong)(uint)size), size._4_4_ != CURLE_OK))
        goto LAB_0011f643;
        size._4_4_ = easysrc_addf(&easysrc_code,"mime%d = NULL;",(ulong)(uint)size);
        break;
      default:
        goto switchD_0011f075_default;
      }
      if (size._4_4_ != CURLE_OK) break;
switchD_0011f075_default:
      if (*(long *)(filename + 0xa0) != 0) {
        free(cp);
        cp = c_escape((char *)**(undefined8 **)(filename + 0xa0),0xffffffffffffffff);
        if (cp == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        size._4_4_ = easysrc_addf(&easysrc_code,"curl_mime_encoder(part%d, \"%s\");",(ulong)*_i,cp);
        if (size._4_4_ != CURLE_OK) break;
      }
      if (escaped != (char *)0x0) {
        free(cp);
        cp = c_escape(escaped,0xffffffffffffffff);
        if (cp == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        size._4_4_ = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, \"%s\");",(ulong)*_i,cp)
        ;
        if (size._4_4_ != CURLE_OK) break;
      }
      if (*(long *)(filename + 0x70) != 0) {
        free(cp);
        cp = c_escape(*(char **)(filename + 0x70),0xffffffffffffffff);
        if (cp == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        size._4_4_ = easysrc_addf(&easysrc_code,"curl_mime_name(part%d, \"%s\");",(ulong)*_i,cp);
        if (size._4_4_ != CURLE_OK) break;
      }
      if (*(long *)(filename + 0x60) != 0) {
        free(cp);
        cp = c_escape(*(char **)(filename + 0x60),0xffffffffffffffff);
        if (cp == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        size._4_4_ = easysrc_addf(&easysrc_code,"curl_mime_type(part%d, \"%s\");",(ulong)*_i,cp);
        if (size._4_4_ != CURLE_OK) break;
      }
      if (*(long *)(filename + 0x58) != 0) {
        uVar2 = (uint)((*(uint *)(filename + 0x80) & 1) != 0);
        size._4_4_ = libcurl_generate_slist(*(curl_slist **)(filename + 0x58),(int *)&size);
        if (((size._4_4_ != CURLE_OK) ||
            (size._4_4_ = easysrc_addf(&easysrc_code,"curl_mime_headers(part%d, slist%d, %d);",
                                       (ulong)*_i,(ulong)(uint)size,(ulong)uVar2),
            size._4_4_ != CURLE_OK)) ||
           ((uVar2 != 0 &&
            (size._4_4_ = easysrc_addf(&easysrc_code,"slist%d = NULL;",(ulong)(uint)size),
            size._4_4_ != CURLE_OK)))) break;
      }
      filename = *(char **)(filename + 0x10);
    } while( true );
  }
LAB_0011f643:
  free(cp);
  return size._4_4_;
}

Assistant:

static CURLcode libcurl_generate_mime(curl_mime *mime, int *mimeno)
{
  CURLcode ret = CURLE_OK;
  int i;
  curl_off_t size;
  curl_mimepart *part;
  char *filename;
  char *escaped = NULL;
  char *cp;
  char *data;

  /* May need several mime variables, so invent name */
  *mimeno = ++easysrc_mime_count;

  DECL1("curl_mime *mime%d;", *mimeno);
  DATA1("mime%d = NULL;", *mimeno);
  CODE1("mime%d = curl_mime_init(hnd);", *mimeno);
  CLEAN1("curl_mime_free(mime%d);", *mimeno);
  CLEAN1("mime%d = NULL;", *mimeno);
  if(mime->firstpart) {
    DECL1("curl_mimepart *part%d;", *mimeno);
    for(part = mime->firstpart; part; part = part->nextpart) {
      CODE2("part%d = curl_mime_addpart(mime%d);", *mimeno, *mimeno);
      filename = part->filename;
      switch(part->kind) {
      case MIMEKIND_FILE:
        Curl_safefree(escaped);
        escaped = c_escape(part->data, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_filedata(part%d, \"%s\");", *mimeno, escaped);
        if(!filename)
          CODE1("curl_mime_filename(part%d, NULL);", *mimeno);
        else {
          /* Fast check to see if remote file name is base name. */
          filename = part->data;
          for(cp = filename; *cp; cp++)
            if(*cp == '/' || *cp == '\\')
              filename = cp + 1;
          if(!part->filename || !strcmp(filename, part->filename))
            filename = NULL;
          else
            filename = part->filename;
        }
        break;
      case MIMEKIND_CALLBACK:
        /* Can only be reading stdin in the current context. */
        CODE1("curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
              *mimeno);
        CODE0("                  (curl_seek_callback) fseek, NULL, stdin);");
        break;
      case MIMEKIND_DATA:
#ifdef CURL_DOES_CONVERSIONS
          /* Data is stored in ASCII and we want in in the host character
             code. Convert it back for output. */
          data = malloc(part->datasize + 1);
          if(!data) {
            ret = CURLE_OUT_OF_MEMORY;
            goto nomem;
          }
          memcpy(data, part->data, part->datasize + 1);
          ret = convert_from_network(data, strlen(data));
          if(ret) {
            Curl_safefree(data);
            goto nomem;
          }
#else
        data = part->data;
#endif

        /* Are there any nul byte in data? */
        for(cp = data; *cp; cp++)
          ;
        size = (cp == data + part->datasize)? (curl_off_t) -1: part->datasize;
        Curl_safefree(escaped);
        escaped = c_escape(data, (size_t) part->datasize);
#ifdef CURL_DOES_CONVERSIONS
        Curl_safefree(data);
#endif
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        if(size >= 0)
          CODE3("curl_mime_data(part%d, \"%s\", %" CURL_FORMAT_CURL_OFF_T ");",
                                *mimeno, escaped, size);
        else
          CODE2("curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                                *mimeno, escaped);
        break;
      case MIMEKIND_MULTIPART:
        ret = libcurl_generate_mime(part->arg, &i);
        if(ret)
          goto nomem;
        CODE2("curl_mime_subparts(part%d, mime%d);", *mimeno, i);
        CODE1("mime%d = NULL;", i);   /* Avoid freeing in CLEAN sequence. */
        break;
      default:
        /* Other cases not possible in this context. */
        break;
      }

      if(part->encoder) {
        Curl_safefree(escaped);
        escaped = c_escape(part->encoder->name, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_encoder(part%d, \"%s\");", *mimeno, escaped);
      }

      if(filename) {
        Curl_safefree(escaped);
        escaped = c_escape(filename, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_filename(part%d, \"%s\");", *mimeno, escaped);
      }

      if(part->name) {
        Curl_safefree(escaped);
        escaped = c_escape(part->name, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_name(part%d, \"%s\");", *mimeno, escaped);
      }

      if(part->mimetype) {
        Curl_safefree(escaped);
        escaped = c_escape(part->mimetype, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_type(part%d, \"%s\");", *mimeno, escaped);
      }

      if(part->userheaders) {
        int ownership = part->flags & MIME_USERHEADERS_OWNER? 1: 0;

        ret = libcurl_generate_slist(part->userheaders, &i);
        if(ret)
          goto nomem;
        CODE3("curl_mime_headers(part%d, slist%d, %d);",
              *mimeno, i, ownership);
        if(ownership)
          CODE1("slist%d = NULL;", i); /* Prevent freeing in CLEAN sequence. */
      }
    }
  }

nomem:
  Curl_safefree(escaped);
  return ret;
}